

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

YieldResult * __thiscall
NEST::NESTcalc::YieldResultValidity
          (YieldResult *__return_storage_ptr__,NESTcalc *this,YieldResult *res,double energy,
          double Wq_eV)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  
  dVar1 = res->ElectronYield;
  if ((dVar1 != -999.0) || (NAN(dVar1))) {
    dVar2 = res->PhotonYield;
    if (((dVar2 != -999.0) || (NAN(dVar2))) &&
       ((res->ExcitonRatio != -999.0 || (NAN(res->ExcitonRatio))))) {
      dVar7 = energy / 0.0085;
      if (dVar7 < dVar2) {
        res->PhotonYield = dVar7;
      }
      if (dVar7 < dVar1) {
        res->ElectronYield = dVar7;
      }
      if (res->PhotonYield <= 0.0 && res->PhotonYield != 0.0) {
        res->PhotonYield = 0.0;
      }
      if (res->ElectronYield <= 0.0 && res->ElectronYield != 0.0) {
        res->ElectronYield = 0.0;
      }
      uVar5 = 0;
      uVar6 = 0x3ff00000;
      dVar1 = res->Lindhard;
      if (dVar1 <= 1.0) {
        uVar5 = SUB84(dVar1,0);
        uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      if ((double)CONCAT44(uVar6,uVar5) <= 0.0) {
        uVar5 = 0;
        uVar6 = 0;
      }
      res->Lindhard = (double)CONCAT44(uVar6,uVar5);
      if (energy < (Wq_eV * 0.001) / (double)CONCAT44(uVar6,uVar5)) {
        res->PhotonYield = 0.0;
        res->ElectronYield = 0.0;
      }
      dVar1 = res->PhotonYield;
      dVar2 = res->ElectronYield;
      dVar7 = res->ExcitonRatio;
      dVar3 = res->Lindhard;
      dVar4 = res->DeltaT_Scint;
      __return_storage_ptr__->ElectricField = res->ElectricField;
      __return_storage_ptr__->DeltaT_Scint = dVar4;
      __return_storage_ptr__->ExcitonRatio = dVar7;
      __return_storage_ptr__->Lindhard = dVar3;
      __return_storage_ptr__->PhotonYield = dVar1;
      __return_storage_ptr__->ElectronYield = dVar2;
      return __return_storage_ptr__;
    }
  }
  __assert_fail("res.ElectronYield != -999 && res.PhotonYield != -999 && res.ExcitonRatio != -999",
                "/workspace/llm4binary/github/license_c_cmakelists/NESTCollaboration[P]nest/src/NEST.cpp"
                ,0x47a,
                "virtual YieldResult NEST::NESTcalc::YieldResultValidity(YieldResult &, const double, const double)"
               );
}

Assistant:

YieldResult NESTcalc::YieldResultValidity(YieldResult &res, const double energy,
                                          const double Wq_eV) {
  assert(res.ElectronYield != -999 && res.PhotonYield != -999 &&
         res.ExcitonRatio != -999);
  if (res.PhotonYield > energy / W_SCINT)
    res.PhotonYield =
        energy / W_SCINT;  // yields can never exceed 1 / [ W ~ few eV ]
  if (res.ElectronYield > energy / W_SCINT)
    res.ElectronYield = energy / W_SCINT;
  if (res.PhotonYield < 0.) res.PhotonYield = 0.;
  if (res.ElectronYield < 0.) res.ElectronYield = 0.;
  res.Lindhard = max(0., min(res.Lindhard, 1.));  // Lindhard Factor
  if (energy < 0.001 * Wq_eV / res.Lindhard) {
    res.PhotonYield = 0.;
    res.ElectronYield = 0.;
  }
  return res;
}